

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

void __thiscall llvm::detail::IEEEFloat::makeSmallestNormalized(IEEEFloat *this,bool Negative)

{
  uint uVar1;
  uint uVar2;
  integerPart *piVar3;
  bool Negative_local;
  IEEEFloat *this_local;
  
  this->field_0x12 = this->field_0x12 & 0xf8 | 2;
  zeroSignificand(this);
  this->field_0x12 = this->field_0x12 & 0xf7 | Negative << 3;
  this->exponent = this->semantics->minExponent;
  uVar1 = this->semantics->precision;
  piVar3 = significandParts(this);
  uVar2 = partCountForBits(this->semantics->precision);
  piVar3[uVar2 - 1] = 1L << ((char)uVar1 - 1U & 0x3f) | piVar3[uVar2 - 1];
  return;
}

Assistant:

void IEEEFloat::makeSmallestNormalized(bool Negative) {
  // We want (in interchange format):
  //   sign = {Negative}
  //   exponent = 0..0
  //   significand = 10..0

  category = fcNormal;
  zeroSignificand();
  sign = Negative;
  exponent = semantics->minExponent;
  significandParts()[partCountForBits(semantics->precision) - 1] |=
      (((integerPart)1) << ((semantics->precision - 1) % integerPartWidth));
}